

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

internal * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (internal *this,char *file,int line)

{
  char *pcVar1;
  String *this_00;
  char *local_70;
  allocator local_51;
  String local_50 [2];
  allocator local_29;
  char *local_28;
  char *file_name;
  char *pcStack_18;
  int line_local;
  char *file_local;
  
  local_70 = file;
  if (file == (char *)0x0) {
    local_70 = "unknown file";
  }
  local_28 = local_70;
  file_name._4_4_ = line;
  pcStack_18 = file;
  file_local = (char *)this;
  if (line < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,local_70,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    this_00 = local_50;
    String::Format(this_00,"%s:%d",local_70,(ulong)(uint)line);
    pcVar1 = String::c_str(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar1,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    String::~String(this_00);
  }
  return this;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const char* const file_name = file == NULL ? kUnknownFile : file;

  if (line < 0)
    return file_name;
  else
    return String::Format("%s:%d", file_name, line).c_str();
}